

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_func_call(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  int iVar1;
  SymbolKind kind;
  undefined8 *puVar2;
  pointer psVar3;
  bool bVar4;
  ExpressNode *pEVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SyntaxAnalyze *in_RSI;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  SharedExNdPtr SVar7;
  string strName;
  SharedExNdPtr param;
  SharedSyPtr func;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  params;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rightParams;
  string tmpPtrName;
  string name;
  string local_180;
  RightVal rightVal;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0 [32];
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  pEVar5 = (ExpressNode *)operator_new(0x48);
  express::ExpressNode::ExpressNode(pEVar5);
  std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<front::express::ExpressNode,void>
            ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)this,pEVar5);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  name.field_2._M_local_buf[0] = '\0';
  param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  params.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  params.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rightParams.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rightParams.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rightParams.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rightVal.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first._M_storage
       = (_Uninitialized<int,_true>)0;
  rightVal.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
  match_one_word(in_RSI,IDENFR);
  word::Word::get_self_abi_cxx11_
            (&strName,(in_RSI->word_list->
                      super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                      _M_impl.super__Vector_impl_data._M_start + in_RSI->matched_index);
  std::__cxx11::string::operator=((string *)&name,(string *)&strName);
  std::__cxx11::string::~string((string *)&strName);
  bVar4 = std::operator==(&name,"starttime");
  if (!bVar4) {
    bVar4 = std::operator==(&name,"stoptime");
    if (!bVar4) goto LAB_00183554;
  }
  strName._M_dataplus._M_p._0_4_ =
       word::Word::get_line_num
                 ((in_RSI->word_list->
                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl
                  .super__Vector_impl_data._M_start + in_RSI->matched_index);
  std::variant<int,int,std::__cxx11::string>::emplace<0ul,unsigned_int>
            ((variant<int,int,std::__cxx11::string> *)&rightVal,(uint *)&strName);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&rightParams,&rightVal);
LAB_00183554:
  std::__cxx11::string::string(local_a0,(string *)&name);
  symbolTable::SymbolTable::find_least_layer_symbol
            ((SymbolTable *)&strName,(string *)&in_RSI->symbolTable);
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)&strName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&strName._M_string_length);
  std::__cxx11::string::~string(local_a0);
  match_one_word(in_RSI,LPARENT);
  bVar4 = try_word(in_RSI,1,RPARENT);
  if (!bVar4) {
    bVar4 = std::operator==(&name,"putf");
    if (bVar4) {
      strName._M_dataplus._M_p = (pointer)&strName.field_2;
      strName._M_string_length = 0;
      strName.field_2._M_local_buf[0] = '\0';
      tmpPtrName._M_dataplus._M_p = (pointer)&tmpPtrName.field_2;
      tmpPtrName._M_string_length = 0;
      tmpPtrName.field_2._M_local_buf[0] = '\0';
      match_one_word(in_RSI,STRCON);
      word::Word::get_self_abi_cxx11_
                (&local_c0,
                 (in_RSI->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_start + in_RSI->matched_index);
      this_00 = &in_RSI->irGenerator;
      irGenerator::irGenerator::ir_declare_string(&local_180,this_00,&local_c0);
      std::__cxx11::string::operator=((string *)&strName,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_c0);
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_180,this_00,Ptr);
      std::__cxx11::string::operator=((string *)&tmpPtrName,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
      _Variant_storage<1ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,std::__cxx11::string> *)&local_58,&tmpPtrName);
      std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
      _Variant_storage<1ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,std::__cxx11::string> *)&local_80,&strName);
      irGenerator::irGenerator::ir_ref(this_00,(LeftVal *)&local_58,(LeftVal *)&local_80,false);
      std::__detail::__variant::
      _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_80);
      std::__detail::__variant::
      _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_58);
      pEVar5 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(pEVar5);
      std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<front::express::ExpressNode,void>
                ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&local_180,
                 pEVar5);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&local_180
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_string_length);
      (param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = VAR;
      (param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _operation = PTR;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_name);
      std::__cxx11::string::~string((string *)&tmpPtrName);
      std::__cxx11::string::~string((string *)&strName);
    }
    else {
      gm_exp((SyntaxAnalyze *)&strName);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&strName);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&strName._M_string_length);
    }
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::push_back(&params,&param);
    while( true ) {
      bVar4 = try_word(in_RSI,1,COMMA);
      if (!bVar4) break;
      match_one_word(in_RSI,COMMA);
      gm_exp((SyntaxAnalyze *)&strName);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&strName);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&strName._M_string_length);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back(&params,(value_type *)
                          &param.
                           super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                 );
    }
  }
  match_one_word(in_RSI,RPARENT);
  std::static_pointer_cast<front::symbol::FunctionSymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)&strName);
  iVar1 = *(int *)(strName._M_dataplus._M_p + 0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&strName._M_string_length);
  if (iVar1 == 0) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&strName,&in_RSI->irGenerator,Int);
    puVar2 = *(undefined8 **)this;
    *puVar2 = 1;
    std::__cxx11::string::_M_assign((string *)(puVar2 + 2));
    std::__cxx11::string::~string((string *)&strName);
  }
  else {
    puVar2 = *(undefined8 **)this;
    *puVar2 = 0x100000001;
    std::__cxx11::string::_M_assign((string *)(puVar2 + 2));
  }
  psVar3 = params.
           super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var6 = &(params.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
      p_Var6 != &psVar3->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
      ; p_Var6 = p_Var6 + 1) {
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&strName,
               p_Var6);
    if (*(int *)strName._M_dataplus._M_p == 0) {
      std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                ((variant<int,int,std::__cxx11::string> *)&rightVal,
                 (int *)(strName._M_dataplus._M_p + 8));
    }
    else {
      std::variant<int,int,std::__cxx11::string>::operator=
                ((variant<int,int,std::__cxx11::string> *)&rightVal,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (strName._M_dataplus._M_p + 0x10));
    }
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&rightParams,(value_type *)&rightVal);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&strName._M_string_length);
  }
  std::__cxx11::string::string((string *)&local_e0,(string *)(*(long *)this + 0x10));
  std::static_pointer_cast<front::symbol::FunctionSymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)&strName);
  kind = *(SymbolKind *)(strName._M_dataplus._M_p + 0x30);
  std::static_pointer_cast<front::symbol::FunctionSymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)&tmpPtrName);
  std::__cxx11::string::string((string *)&local_120,(string *)(tmpPtrName._M_dataplus._M_p + 8));
  irGenerator::irGenerator::getFunctionName(&local_100,&in_RSI->irGenerator,&local_120);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_138,&rightParams);
  irGenerator::irGenerator::ir_function_call
            (&in_RSI->irGenerator,&local_e0,kind,&local_100,&local_138,false);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_138);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmpPtrName._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&strName._M_string_length);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&rightVal);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&rightParams);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&params);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&param.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  SVar7.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar7.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar7.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_func_call() {
  SharedExNdPtr node(new ExpressNode());
  SharedSyPtr func;
  string name;
  SharedExNdPtr param;
  vector<SharedExNdPtr> params;
  vector<RightVal> rightParams;
  RightVal rightVal;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();
  if (name == "starttime" || name == "stoptime") {
    rightVal.emplace<0>(get_least_matched_word().get_line_num());
    rightParams.push_back(rightVal);
  }

  func = symbolTable.find_least_layer_symbol(name);

  match_one_word(Token::LPARENT);
  if (!try_word(1, Token::RPARENT)) {
    if (name == "putf") {
      string strName;
      string tmpPtrName;

      match_one_word(Token::STRCON);

      strName =
          irGenerator.ir_declare_string(get_least_matched_word().get_self());
      tmpPtrName = irGenerator.getNewTmpValueName(TyKind::Ptr);
      irGenerator.ir_ref(tmpPtrName, strName);

      param = SharedExNdPtr(new ExpressNode());
      param->_type = NodeType::VAR;
      param->_operation = OperationType::PTR;
      param->_name = tmpPtrName;
    } else {
      param = gm_exp();
    }
    params.push_back(param);

    while (try_word(1, Token::COMMA)) {
      match_one_word(Token::COMMA);
      param = gm_exp();
      params.push_back(param);
    }
  }
  match_one_word(Token::RPARENT);

  if (std::static_pointer_cast<FunctionSymbol>(func)->getRet() ==
      SymbolKind::INT) {
    string retValue = irGenerator.getNewTmpValueName(TyKind::Int);
    node->_type = NodeType::VAR;
    node->_operation = OperationType::RETURN_FUNC_CALL;
    node->_name = retValue;
  } else {
    node->_type = NodeType::VAR;
    node->_operation = OperationType::VOID_FUNC_CALL;
    node->_name = name;
  }

  for (auto var : params) {
    if (var->_type == NodeType::CNS) {
      rightVal.emplace<0>(var->_value);
    } else {
      rightVal = var->_name;
    }
    rightParams.push_back(rightVal);
  }
  irGenerator.ir_function_call(
      node->_name, std::static_pointer_cast<FunctionSymbol>(func)->getRet(),
      irGenerator.getFunctionName(
          std::static_pointer_cast<FunctionSymbol>(func)->getName()),
      rightParams);

  return node;
}